

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O0

SUNErrCode SUNContext_Create(SUNComm comm,SUNContext *sunctx_out)

{
  undefined8 *__ptr;
  undefined8 *in_RSI;
  undefined4 in_EDI;
  SUNComm unaff_retaddr;
  SUNContext sunctx_local_scope_;
  SUNErrHandler_conflict eh;
  SUNContext sunctx;
  SUNLogger logger;
  SUNProfiler profiler;
  SUNErrCode err;
  SUNErrHandler *in_stack_ffffffffffffffb8;
  undefined8 *eh_data;
  SUNLogger *logger_ptr;
  int local_14;
  undefined4 in_stack_fffffffffffffffc;
  
  logger_ptr = (SUNLogger *)0x0;
  *in_RSI = 0;
  __ptr = (undefined8 *)malloc(0x30);
  if (__ptr == (undefined8 *)0x0) {
    local_14 = -0x2704;
  }
  else {
    eh_data = __ptr;
    local_14 = SUNLogger_CreateFromEnv
                         (unaff_retaddr,(SUNLogger *)CONCAT44(in_stack_fffffffffffffffc,in_EDI));
    if ((local_14 == 0) &&
       (local_14 = SUNErrHandler_Create
                             ((SUNErrHandlerFn)logger_ptr,eh_data,in_stack_ffffffffffffffb8),
       local_14 == 0)) {
      __ptr[2] = 0;
      *(undefined4 *)(__ptr + 3) = 0;
      *__ptr = 0;
      *(undefined4 *)(__ptr + 1) = 0;
      *(undefined4 *)((long)__ptr + 0x1c) = 0;
      __ptr[4] = logger_ptr;
      *(undefined4 *)(__ptr + 5) = in_EDI;
    }
    if (local_14 == 0) {
      *in_RSI = __ptr;
    }
    else {
      SUNLogger_Destroy(logger_ptr);
      free(__ptr);
    }
  }
  return local_14;
}

Assistant:

SUNErrCode SUNContext_Create(SUNComm comm, SUNContext* sunctx_out)
{
  SUNErrCode err       = SUN_SUCCESS;
  SUNProfiler profiler = NULL;
  SUNLogger logger     = NULL;
  SUNContext sunctx    = NULL;
  SUNErrHandler eh     = NULL;

  *sunctx_out = NULL;
  sunctx      = (SUNContext)malloc(sizeof(struct SUNContext_));

  /* SUNContext_Create cannot assert or log since the SUNContext is not yet
   * created */
  if (!sunctx) { return SUN_ERR_MALLOC_FAIL; }

  SUNFunctionBegin(sunctx);

#ifdef SUNDIALS_ADIAK_ENABLED
  adiak_init(&comm);
  sunAdiakCollectMetadata();
#endif

  do {
#if SUNDIALS_LOGGING_LEVEL > 0
#if SUNDIALS_MPI_ENABLED
    err = SUNLogger_CreateFromEnv(comm, &logger);
    SUNCheckCallNoRet(err);
    if (err) { break; }
#else
    err = SUNLogger_CreateFromEnv(SUN_COMM_NULL, &logger);
    SUNCheckCallNoRet(err);
    if (err) { break; }
#endif
#else
    err = SUNLogger_Create(SUN_COMM_NULL, 0, &logger);
    SUNCheckCallNoRet(err);
    if (err) { break; }
    err = SUNLogger_SetErrorFilename(logger, "");
    SUNCheckCallNoRet(err);
    if (err) { break; }
    err = SUNLogger_SetWarningFilename(logger, "");
    SUNCheckCallNoRet(err);
    if (err) { break; }
    err = SUNLogger_SetInfoFilename(logger, "");
    SUNCheckCallNoRet(err);
    if (err) { break; }
    err = SUNLogger_SetDebugFilename(logger, "");
    SUNCheckCallNoRet(err);
    if (err) { break; }
#endif

#if defined(SUNDIALS_BUILD_WITH_PROFILING) && !defined(SUNDIALS_CALIPER_ENABLED)
    err = SUNProfiler_Create(comm, "SUNContext Default", &profiler);
    SUNCheckCallNoRet(err);
    if (err) { break; }
#endif

    err = SUNErrHandler_Create(SUNLogErrHandlerFn, NULL, &eh);
    SUNCheckCallNoRet(err);
    if (err) { break; }

    sunctx->logger       = logger;
    sunctx->own_logger   = logger != NULL;
    sunctx->profiler     = profiler;
    sunctx->own_profiler = profiler != NULL;
    sunctx->last_err     = SUN_SUCCESS;
    sunctx->err_handler  = eh;
    sunctx->comm         = comm;
  }
  while (0);

  if (err)
  {
#if defined(SUNDIALS_BUILD_WITH_PROFILING) && !defined(SUNDIALS_CALIPER_ENABLED)
    SUNCheckCallNoRet(SUNProfiler_Free(&profiler));
#endif
    SUNCheckCallNoRet(SUNLogger_Destroy(&logger));
    free(sunctx);
  }
  else { *sunctx_out = sunctx; }

  return err;
}